

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O3

void __thiscall
Js::RecyclableArgumentsArrayWalker::FetchFormalsAddress
          (RecyclableArgumentsArrayWalker *this,LocalsWalker *localsWalker)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  undefined4 extraout_var;
  FunctionBody *this_00;
  void *pvVar5;
  IDiagObjectAddress *pIVar6;
  ArenaAllocator *alloc;
  List<Js::IDiagObjectAddress_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_01;
  uint *puVar7;
  uint uVar8;
  ulong uVar9;
  DiagStackFrame *pDVar10;
  bool local_31 [8];
  bool isConst;
  
  if (localsWalker == (LocalsWalker *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xc38,"(localsWalker)","localsWalker");
    if (!bVar2) goto LAB_008b6af4;
    *puVar4 = 0;
  }
  pDVar10 = localsWalker->pFrame;
  if (pDVar10 == (DiagStackFrame *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xc39,"(localsWalker->pFrame)","localsWalker->pFrame");
    if (!bVar2) goto LAB_008b6af4;
    *puVar4 = 0;
    pDVar10 = localsWalker->pFrame;
  }
  iVar3 = (*pDVar10->_vptr_DiagStackFrame[2])();
  this_00 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)CONCAT44(extraout_var,iVar3));
  if (this_00 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xc3b,"(pFBody)","pFBody");
    if (!bVar2) {
LAB_008b6af4:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pvVar5 = FunctionProxy::GetAuxPtr((FunctionProxy *)this_00,PropertyIdOnRegSlotsContainer);
  if ((pvVar5 != (void *)0x0) && (puVar7 = *(uint **)((long)pvVar5 + 0x10), puVar7 != (uint *)0x0))
  {
    uVar8 = *puVar7;
    if (uVar8 != 0) {
      uVar9 = 0;
      do {
        if (puVar7[uVar9 + 2] != 0xffffffff) {
          local_31[0] = false;
          pIVar6 = LocalsWalker::FindPropertyAddress(localsWalker,puVar7[uVar9 + 2],false,local_31);
          if (pIVar6 != (IDiagObjectAddress *)0x0) {
            this_01 = this->pFormalsList;
            if (this_01 ==
                (List<Js::IDiagObjectAddress_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 *)0x0) {
              alloc = GetArenaFromContext((this->super_RecyclableArrayWalker).
                                          super_RecyclableObjectWalker.scriptContext);
              this_01 = (List<Js::IDiagObjectAddress_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                         *)new<Memory::ArenaAllocator>(0x30,alloc,0x364470);
              (this_01->
              super_ReadOnlyList<Js::IDiagObjectAddress_*,_Memory::ArenaAllocator,_DefaultComparer>)
              .alloc = alloc;
              (this_01->
              super_ReadOnlyList<Js::IDiagObjectAddress_*,_Memory::ArenaAllocator,_DefaultComparer>)
              ._vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014e4958;
              (this_01->
              super_ReadOnlyList<Js::IDiagObjectAddress_*,_Memory::ArenaAllocator,_DefaultComparer>)
              .buffer = (Type)0x0;
              (this_01->
              super_ReadOnlyList<Js::IDiagObjectAddress_*,_Memory::ArenaAllocator,_DefaultComparer>)
              .count = 0;
              this_01->length = 0;
              this_01->increment = 4;
              this->pFormalsList = this_01;
            }
            JsUtil::
            List<Js::IDiagObjectAddress_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::EnsureArray(this_01,0);
            iVar3 = (this_01->
                    super_ReadOnlyList<Js::IDiagObjectAddress_*,_Memory::ArenaAllocator,_DefaultComparer>
                    ).count;
            (this_01->
            super_ReadOnlyList<Js::IDiagObjectAddress_*,_Memory::ArenaAllocator,_DefaultComparer>).
            buffer[iVar3] = pIVar6;
            (this_01->
            super_ReadOnlyList<Js::IDiagObjectAddress_*,_Memory::ArenaAllocator,_DefaultComparer>).
            count = iVar3 + 1;
          }
          puVar7 = *(uint **)((long)pvVar5 + 0x10);
          uVar8 = *puVar7;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < uVar8);
    }
  }
  return;
}

Assistant:

void RecyclableArgumentsArrayWalker::FetchFormalsAddress(LocalsWalker * localsWalker)
    {
        Assert(localsWalker);
        Assert(localsWalker->pFrame);
        Js::FunctionBody *pFBody = localsWalker->pFrame->GetJavascriptFunction()->GetFunctionBody();
        Assert(pFBody);

        PropertyIdOnRegSlotsContainer * container = pFBody->GetPropertyIdOnRegSlotsContainer();
        if (container &&  container->propertyIdsForFormalArgs)
        {
            for (uint32 i = 0; i < container->propertyIdsForFormalArgs->count; i++)
            {
                if (container->propertyIdsForFormalArgs->elements[i] != Js::Constants::NoRegister)
                {
                    bool isConst = false;
                    IDiagObjectAddress * address = localsWalker->FindPropertyAddress(container->propertyIdsForFormalArgs->elements[i], false, isConst);
                    if (address)
                    {
                        if (pFormalsList == nullptr)
                        {
                            pFormalsList = JsUtil::List<IDiagObjectAddress *, ArenaAllocator>::New(GetArenaFromContext(scriptContext));
                        }

                        pFormalsList->Add(address);
                    }
                }
            }
        }
    }